

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_ds.h
# Opt level: O1

void * stbds_arrgrowf(void *a,size_t elemsize,size_t addlen,size_t min_cap)

{
  long lVar1;
  ulong uVar2;
  undefined8 *puVar3;
  ulong uVar4;
  void *__ptr;
  
  if (a == (void *)0x0) {
    lVar1 = 0;
  }
  else {
    lVar1 = *(long *)((long)a + -0x20);
  }
  uVar2 = lVar1 + addlen;
  if (lVar1 + addlen <= min_cap) {
    uVar2 = min_cap;
  }
  if (a == (void *)0x0) {
    uVar4 = 0;
  }
  else {
    uVar4 = *(ulong *)((long)a + -0x18);
  }
  if (uVar4 < uVar2) {
    if (a == (void *)0x0) {
      uVar4 = 0;
    }
    else {
      uVar4 = *(long *)((long)a + -0x18) * 2;
    }
    if (uVar2 < uVar4) {
      if (a == (void *)0x0) {
        uVar4 = 0;
      }
      else {
        uVar4 = *(long *)((long)a + -0x18) * 2;
      }
    }
    else {
      uVar4 = 4;
      if (4 < uVar2) {
        uVar4 = uVar2;
      }
    }
    __ptr = (void *)((long)a + -0x20);
    if (a == (void *)0x0) {
      __ptr = (void *)0x0;
    }
    puVar3 = (undefined8 *)realloc(__ptr,elemsize * uVar4 + 0x20);
    if (a == (void *)0x0) {
      *puVar3 = 0;
      puVar3[2] = 0;
      puVar3[3] = 0;
    }
    a = puVar3 + 4;
    puVar3[1] = uVar4;
  }
  return (undefined8 *)a;
}

Assistant:

void *stbds_arrgrowf(void *a, size_t elemsize, size_t addlen, size_t min_cap)
{
  stbds_array_header temp={0}; // force debugging
  void *b;
  size_t min_len = stbds_arrlen(a) + addlen;
  (void) sizeof(temp);

  // compute the minimum capacity needed
  if (min_len > min_cap)
    min_cap = min_len;

  if (min_cap <= stbds_arrcap(a))
    return a;

  // increase needed capacity to guarantee O(1) amortized
  if (min_cap < 2 * stbds_arrcap(a))
    min_cap = 2 * stbds_arrcap(a);
  else if (min_cap < 4)
    min_cap = 4;

  //if (num_prev < 65536) if (a) prev_allocs[num_prev++] = (int *) ((char *) a+1);
  //if (num_prev == 2201)
  //  num_prev = num_prev;
  b = STBDS_REALLOC(NULL, (a) ? stbds_header(a) : 0, elemsize * min_cap + sizeof(stbds_array_header));
  //if (num_prev < 65536) prev_allocs[num_prev++] = (int *) (char *) b;
  b = (char *) b + sizeof(stbds_array_header);
  if (a == NULL) {
    stbds_header(b)->length = 0;
    stbds_header(b)->hash_table = 0;
    stbds_header(b)->temp = 0;
  } else {
    STBDS_STATS(++stbds_array_grow);
  }
  stbds_header(b)->capacity = min_cap;

  return b;
}